

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::HarvestGeneralBody
               (double *x,int x_length,int fs,int frame_period,double f0_floor,double f0_ceil,
               double channels_in_octave,int speed,double allowed_range,double *temporal_positions,
               double *f0)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  ulong uVar11;
  void *pvVar12;
  double *f0_00;
  void *pvVar13;
  double **f0_candidates_00;
  double **refined_f0_candidates;
  double *pdVar14;
  void *pvVar15;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  long in_R9;
  double in_XMM0_Qa;
  double dVar16;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  double in_stack_00000010;
  int in_stack_00000018;
  int in_stack_0000001c;
  double *in_stack_00000020;
  fft_complex *in_stack_00000030;
  int i_3;
  double *best_f0_contour;
  int number_of_candidates;
  int i_2;
  double **f0_candidates_score;
  double **f0_candidates;
  int max_candidates;
  int overlap_parameter;
  int i_1;
  int f0_length;
  fft_complex *y_spectrum;
  double *y;
  int fft_size;
  double actual_fs;
  int y_length;
  int decimation_ratio;
  int i;
  double *boundary_f0_list;
  int number_of_channels;
  double adjusted_f0_ceil;
  double adjusted_f0_floor;
  undefined4 in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  double *in_stack_fffffffffffffee8;
  double **in_stack_fffffffffffffef0;
  double **in_stack_fffffffffffffef8;
  double **in_stack_ffffffffffffff00;
  fft_complex *in_stack_ffffffffffffff08;
  double **in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  double in_stack_ffffffffffffff20;
  double in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff40;
  int local_bc;
  double **ppdVar17;
  int iVar18;
  int local_6c;
  
  dVar16 = log((in_XMM1_Qa * 1.1) / (in_XMM0_Qa * 0.9));
  iVar9 = (int)((dVar16 / 0.6931471805599453) * in_XMM2_Qa) + 1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar9;
  uVar11 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pvVar12 = operator_new__(uVar11);
  for (local_6c = 0; local_6c < iVar9; local_6c = local_6c + 1) {
    in_stack_ffffffffffffff28 = in_XMM0_Qa * 0.9;
    dVar16 = pow(2.0,(double)(local_6c + 1) / in_XMM2_Qa);
    *(double *)((long)pvVar12 + (long)local_6c * 8) = in_stack_ffffffffffffff28 * dVar16;
  }
  iVar10 = MyMinInt(in_R8D,0xc);
  iVar10 = MyMaxInt(iVar10,1);
  ceil((double)in_ESI / (double)iVar10);
  iVar10 = GetSuitableFFTSize(0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar10;
  uVar11 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  f0_00 = (double *)operator_new__(uVar11);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iVar10;
  uVar11 = SUB168(auVar3 * ZEXT816(0x10),0);
  if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar11);
  GetWaveformAndSpectrum
            (in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000010,
             in_stack_0000000c,in_stack_00000008,unaff_retaddr,in_stack_00000030);
  iVar10 = GetSamplesForHarvest(in_EDX,in_ESI,(double)in_ECX);
  for (iVar18 = 0; iVar18 < iVar10; iVar18 = iVar18 + 1) {
    *(double *)(in_R9 + (long)iVar18 * 8) = (double)(iVar18 * in_ECX) / 1000.0;
    *(undefined8 *)(CONCAT44(in_stack_0000000c,in_stack_00000008) + (long)iVar18 * 8) = 0;
  }
  iVar9 = matlab_round((double)iVar9 / 10.0);
  iVar9 = iVar9 * 7;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)iVar10;
  uVar11 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  f0_candidates_00 = (double **)operator_new__(uVar11);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)iVar10;
  uVar11 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  refined_f0_candidates = (double **)operator_new__(uVar11);
  for (local_bc = 0; local_bc < iVar10; local_bc = local_bc + 1) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)iVar9;
    uVar11 = SUB168(auVar6 * ZEXT816(8),0);
    if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    pdVar14 = (double *)operator_new__(uVar11);
    f0_candidates_00[local_bc] = pdVar14;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)iVar9;
    uVar11 = SUB168(auVar7 * ZEXT816(8),0);
    if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    pdVar14 = (double *)operator_new__(uVar11);
    refined_f0_candidates[local_bc] = pdVar14;
  }
  ppdVar17 = f0_candidates_00;
  HarvestGeneralBodySub
            ((double *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),SUB84(in_stack_ffffffffffffff28,0),
             in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (double *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff40
             ,(double)in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8,
             (int)refined_f0_candidates,f0_candidates_00);
  RefineF0Candidates((double *)in_stack_ffffffffffffff00,
                     (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (double)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,(double)f0_candidates_00,
                     (double)CONCAT44(in_stack_fffffffffffffed4,iVar9),refined_f0_candidates,
                     in_stack_ffffffffffffff10);
  RemoveUnreliableCandidates
            ((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(int)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (long)iVar10;
  uVar11 = SUB168(auVar8 * ZEXT816(8),0);
  if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pvVar15 = operator_new__(uVar11);
  FixF0Contour(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
               (double)in_stack_fffffffffffffee8,
               (double *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  SmoothF0Contour(f0_00,(int)((ulong)pvVar13 >> 0x20),(double *)CONCAT44(iVar10,iVar18));
  if (f0_00 != (double *)0x0) {
    operator_delete__(f0_00);
  }
  if (pvVar15 != (void *)0x0) {
    operator_delete__(pvVar15);
  }
  if (pvVar13 != (void *)0x0) {
    operator_delete__(pvVar13);
  }
  for (iVar9 = 0; iVar9 < iVar10; iVar9 = iVar9 + 1) {
    if (ppdVar17[iVar9] != (double *)0x0) {
      operator_delete__(ppdVar17[iVar9]);
    }
    if (refined_f0_candidates[iVar9] != (double *)0x0) {
      operator_delete__(refined_f0_candidates[iVar9]);
    }
  }
  if (ppdVar17 != (double **)0x0) {
    operator_delete__(ppdVar17);
  }
  if (refined_f0_candidates != (double **)0x0) {
    operator_delete__(refined_f0_candidates);
  }
  if (pvVar12 != (void *)0x0) {
    operator_delete__(pvVar12);
  }
  return;
}

Assistant:

static void HarvestGeneralBody(const double *x, int x_length, int fs,
    int frame_period, double f0_floor, double f0_ceil,
#if 0
    double channels_in_octave, int speed, double *temporal_positions,
    double *f0) {
#else
    double channels_in_octave, int speed, double allowed_range,
    double *temporal_positions, double *f0) {
#endif
  double adjusted_f0_floor = f0_floor * 0.9;
  double adjusted_f0_ceil = f0_ceil * 1.1;
  int number_of_channels =
    1 + static_cast<int>(log(adjusted_f0_ceil / adjusted_f0_floor) /
    world::kLog2 * channels_in_octave);
  double *boundary_f0_list = new double[number_of_channels];
  for (int i = 0; i < number_of_channels; ++i)
    boundary_f0_list[i] =
    adjusted_f0_floor * pow(2.0, (i + 1) / channels_in_octave);

  // normalization
  int decimation_ratio = MyMaxInt(MyMinInt(speed, 12), 1);
  int y_length =
    static_cast<int>(ceil(static_cast<double>(x_length) / decimation_ratio));
  double actual_fs = static_cast<double>(fs) / decimation_ratio;
  int fft_size = GetSuitableFFTSize(y_length + 5 +
    2 * static_cast<int>(2.0 * actual_fs / boundary_f0_list[0]));

  // Calculation of the spectrum used for the f0 estimation
  double *y = new double[fft_size];
  fft_complex *y_spectrum = new fft_complex[fft_size];
  GetWaveformAndSpectrum(x, x_length, y_length, actual_fs, fft_size,
      decimation_ratio, y, y_spectrum);

  int f0_length = GetSamplesForHarvest(fs, x_length, frame_period);
  for (int i = 0; i < f0_length; ++i) {
    temporal_positions[i] = i * frame_period / 1000.0;
    f0[i] = 0.0;
  }

  int overlap_parameter = 7;
  int max_candidates =
    matlab_round(number_of_channels / 10.0) * overlap_parameter;
  double **f0_candidates = new double *[f0_length];
  double **f0_candidates_score = new double *[f0_length];
  for (int i = 0; i < f0_length; ++i) {
    f0_candidates[i] = new double[max_candidates];
    f0_candidates_score[i] = new double[max_candidates];
  }

  int number_of_candidates = HarvestGeneralBodySub(boundary_f0_list,
    number_of_channels, f0_length, actual_fs, y_length, temporal_positions,
    y_spectrum, fft_size, f0_floor, f0_ceil, max_candidates, f0_candidates) *
    overlap_parameter;

  RefineF0Candidates(y, y_length, actual_fs, temporal_positions, f0_length,
      number_of_candidates, f0_floor, f0_ceil, f0_candidates,
      f0_candidates_score);
  RemoveUnreliableCandidates(f0_length, number_of_candidates,
      f0_candidates, f0_candidates_score);

  double *best_f0_contour = new double[f0_length];
  FixF0Contour(f0_candidates, f0_candidates_score, f0_length,
#if 0
      number_of_candidates, best_f0_contour);
#else
      number_of_candidates, allowed_range, best_f0_contour);
#endif
  SmoothF0Contour(best_f0_contour, f0_length, f0);

  delete[] y;
  delete[] best_f0_contour;
  delete[] y_spectrum;
  for (int i = 0; i < f0_length; ++i) {
    delete[] f0_candidates[i];
    delete[] f0_candidates_score[i];
  }
  delete[] f0_candidates;
  delete[] f0_candidates_score;
  delete[] boundary_f0_list;
}